

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLReader::handleEOL(XMLReader *this,XMLCh *curCh,bool inDecl)

{
  XMLCh XVar1;
  bool bVar2;
  ulong uVar3;
  TranscodingException *this_00;
  
  XVar1 = *curCh;
  if (XVar1 == L'\n') {
    this->fCurCol = 1;
    this->fCurLine = this->fCurLine + 1;
    return;
  }
  if ((XVar1 == L'\x2028') || (XVar1 == L'\x85')) {
    if ((inDecl) && (this->fXMLVersion == XMLV1_1)) {
      this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
      TranscodingException::TranscodingException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                 ,0x80d,Reader_NelLsepinDecl,this->fSystemId,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                 this->fMemoryManager);
      __cxa_throw(this_00,&TranscodingException::typeinfo,XMLException::~XMLException);
    }
    if (this->fNEL != true) {
      return;
    }
    if (this->fSource != Source_External) {
      return;
    }
    this->fCurCol = 1;
    this->fCurLine = this->fCurLine + 1;
  }
  else {
    if (XVar1 != L'\r') {
      this->fCurCol = this->fCurCol + 1;
      return;
    }
    this->fCurCol = 1;
    this->fCurLine = this->fCurLine + 1;
    if (this->fSource != Source_External) {
      return;
    }
    uVar3 = this->fCharIndex;
    if (this->fCharsAvail <= uVar3) {
      bVar2 = refreshCharBuffer(this);
      if (!bVar2) goto LAB_002bf74a;
      uVar3 = this->fCharIndex;
    }
    if ((this->fCharBuf[uVar3] == L'\n') ||
       ((this->fCharBuf[uVar3] == L'\x85' && (this->fNEL == true)))) {
      this->fCharIndex = uVar3 + 1;
    }
  }
LAB_002bf74a:
  *curCh = L'\n';
  return;
}

Assistant:

void XMLReader::handleEOL(XMLCh& curCh, bool inDecl)
{
    // 1. the two-character sequence #xD #xA
    // 2. the two-character sequence #xD #x85
    // 5. any #xD character that is not immediately followed by #xA or #x85.
    switch(curCh)
    {
    case chCR:
        fCurCol = 1;
        fCurLine++;

        //
        //  If not already internalized, then convert it to an
        //  LF and eat any following LF.
        //
        if (fSource == Source_External)
        {
            if ((fCharIndex < fCharsAvail) || refreshCharBuffer())
            {
                if ( fCharBuf[fCharIndex] == chLF              ||
                    ((fCharBuf[fCharIndex] == chNEL) && fNEL)  )
                {
                    fCharIndex++;
                }
            }
            curCh = chLF;
        }
        break;

    case chLF:
        fCurCol = 1;
        fCurLine++;
        break;

    // 3. the single character #x85
    // 4. the single character #x2028
    case chNEL:
    case chLineSeparator:
        if (inDecl && fXMLVersion == XMLV1_1)
        {

        /***
         * XML1.1
         *
         * 2.11 End-of-Line Handling
         *  ...
         *   The characters #x85 and #x2028 cannot be reliably recognized and translated
         *   until an entity's encoding declaration (if present) has been read.
         *   Therefore, it is a fatal error to use them within the XML declaration or
         *   text declaration.
         *
         ***/
            ThrowXMLwithMemMgr1
                (
                TranscodingException
                , XMLExcepts::Reader_NelLsepinDecl
                , fSystemId
                , fMemoryManager
                );
        }

        if (fNEL && fSource == Source_External)
        {
            fCurCol = 1;
            fCurLine++;
            curCh = chLF;
        }
        break;
    default:
        fCurCol++;
    }
}